

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O2

int cuddTreeSifting(DdManager *table,Cudd_ReorderingType method)

{
  MtrNode *pMVar1;
  int iVar2;
  MtrNode *treenode;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  
  pMVar1 = table->tree;
  treenode = pMVar1;
  if (pMVar1 == (MtrNode *)0x0) {
    treenode = Mtr_InitGroupTree(0,table->size);
    table->tree = treenode;
    treenode->index = *table->invperm;
  }
  uVar4 = 0;
  uVar3 = (ulong)(uint)table->size;
  if (table->size < 1) {
    uVar3 = uVar4;
  }
  lVar5 = 0x1c;
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    *(int *)((long)&table->subtables->nodelist + lVar5) = (int)uVar4;
    lVar5 = lVar5 + 0x38;
  }
  iVar2 = ddTreeSiftingAux(table,treenode,method);
  if (pMVar1 == (MtrNode *)0x0) {
    Cudd_FreeTree(table);
  }
  return iVar2;
}

Assistant:

int
cuddTreeSifting(
  DdManager * table /* DD table */,
  Cudd_ReorderingType method /* reordering method for the groups of leaves */)
{
    int i;
    int nvars;
    int result;
    int tempTree;

    /* If no tree is provided we create a temporary one in which all
    ** variables are in a single group. After reordering this tree is
    ** destroyed.
    */
    tempTree = table->tree == NULL;
    if (tempTree) {
        table->tree = Mtr_InitGroupTree(0,table->size);
        table->tree->index = table->invperm[0];
    }
    nvars = table->size;

#ifdef DD_DEBUG
    if (pr > 0 && !tempTree) (void) fprintf(table->out,"cuddTreeSifting:");
    Mtr_PrintGroups(table->tree,pr <= 0);
#endif

#ifdef DD_STATS
    extsymmcalls = 0;
    extsymm = 0;
    secdiffcalls = 0;
    secdiff = 0;
    secdiffmisfire = 0;

    (void) fprintf(table->out,"\n");
    if (!tempTree)
        (void) fprintf(table->out,"#:IM_NODES  %8d: group tree nodes\n",
                       ddCountInternalMtrNodes(table,table->tree));
#endif

    /* Initialize the group of each subtable to itself. Initially
    ** there are no groups. Groups are created according to the tree
    ** structure in postorder fashion.
    */
    for (i = 0; i < nvars; i++)
        table->subtables[i].next = i;


    /* Reorder. */
    result = ddTreeSiftingAux(table, table->tree, method);

#ifdef DD_STATS         /* print stats */
    if (!tempTree && method == CUDD_REORDER_GROUP_SIFT &&
        (table->groupcheck == CUDD_GROUP_CHECK7 ||
         table->groupcheck == CUDD_GROUP_CHECK5)) {
        (void) fprintf(table->out,"\nextsymmcalls = %d\n",extsymmcalls);
        (void) fprintf(table->out,"extsymm = %d",extsymm);
    }
    if (!tempTree && method == CUDD_REORDER_GROUP_SIFT &&
        table->groupcheck == CUDD_GROUP_CHECK7) {
        (void) fprintf(table->out,"\nsecdiffcalls = %d\n",secdiffcalls);
        (void) fprintf(table->out,"secdiff = %d\n",secdiff);
        (void) fprintf(table->out,"secdiffmisfire = %d",secdiffmisfire);
    }
#endif

    if (tempTree)
        Cudd_FreeTree(table);
    return(result);

}